

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O2

void __thiscall
Synthesizer::SynthesizerChannel::NoteOff
          (SynthesizerChannel *this,int note,int velocity,float *p,float sampletime)

{
  Voice *pVVar1;
  float fVar2;
  
  pVVar1 = this->keys[note];
  if (pVVar1 != (Voice *)0x0) {
    fVar2 = powf(0.0001,pVVar1->sampletime / pVVar1->p[5]);
    pVVar1->aenvdecay = fVar2;
    pVVar1->fenvdecay = fVar2;
    if (this->keys[note] == pVVar1) {
      this->keys[note] = (Voice *)0x0;
    }
  }
  return;
}

Assistant:

void NoteOff(int note, int velocity, float* p, float sampletime)
        {
            Voice* v = keys[note];
            if (v == NULL)
                return;
            v->NoteOff(note, velocity);
            if (keys[note] == v)
                keys[note] = NULL;
        }